

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O3

void __thiscall sjtu::UserManager::login(UserManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  long lVar3;
  string *psVar4;
  long lVar5;
  int iVar6;
  pair<long,_bool> pVar7;
  string usname;
  string uspass;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  UserManager *local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  long local_48;
  undefined1 local_40;
  ulong local_38;
  
  local_b0 = &local_a0;
  iVar6 = 0;
  local_a8 = 0;
  local_a0 = 0;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  if (0 < argc) {
    local_70 = this;
    do {
      iVar1 = std::__cxx11::string::compare((char *)argv);
      psVar4 = (string *)&local_b0;
      if ((iVar1 == 0) ||
         (iVar1 = std::__cxx11::string::compare((char *)argv), psVar4 = (string *)&local_90,
         iVar1 == 0)) {
        std::__cxx11::string::_M_assign(psVar4);
      }
      argv = argv + 2;
      iVar6 = iVar6 + 2;
      this = local_70;
    } while (iVar6 < argc);
  }
  this_00 = this->UserBpTree;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_b0,local_b0 + local_a8);
  if (local_60 == 0) {
    local_38 = 0;
  }
  else {
    lVar5 = 0;
    lVar3 = 0;
    local_38 = 0;
    do {
      lVar3 = ((long)*(char *)((long)local_68 + lVar5) + lVar3 * 0x239 + 0x100) % 0x3b800001;
      local_38 = (long)((long)*(char *)((long)local_68 + lVar5) + local_38 * 0x301 + 0x100) %
                 0x3b9aca07;
      lVar5 = lVar5 + 1;
    } while (local_60 != lVar5);
    local_38 = lVar3 << 0x20 | local_38;
  }
  pVar7 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_38);
  local_48 = pVar7.first;
  local_40 = pVar7.second;
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  else {
    iVar6 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_48);
    iVar1 = std::__cxx11::string::compare((char *)&local_90);
    if ((iVar1 == 0) && (*(uint *)(CONCAT44(extraout_var,iVar6) + 0x6c) != this->online_flag)) {
      *(uint *)(CONCAT44(extraout_var,iVar6) + 0x6c) = this->online_flag;
      (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])();
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    }
    else {
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    }
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void login(int argc, std::string *argv) {
            std::string usname, uspass;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
            }
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(usname));
            if (tmp.second == true) {
                userType *user = UserFile->read(tmp.first);
                if (uspass == user->password && user->is_online != online_flag) {
                    user->is_online = online_flag;
                    UserFile->save(user->offset);
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }